

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46dcfc::TransformSelector::~TransformSelector(TransformSelector *this)

{
  TransformSelector *this_local;
  
  this->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_00f4c0e0;
  std::__cxx11::string::~string((string *)&this->Tag);
  return;
}

Assistant:

virtual ~TransformSelector() = default;